

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O0

void __thiscall
QTableViewPrivate::drawCell
          (QTableViewPrivate *this,QPainter *painter,QStyleOptionViewItem *option,QModelIndex *index
          )

{
  QAbstractItemModel *pQVar1;
  bool bVar2;
  Int IVar3;
  Int IVar4;
  QTableView *pQVar5;
  QItemSelectionModel *pQVar6;
  ulong uVar7;
  QStyle *pQVar8;
  long *plVar9;
  undefined8 in_RCX;
  undefined8 in_RSI;
  QTableViewPrivate *in_RDI;
  long in_FS_OFFSET;
  bool focus;
  ColorGroup cg;
  QTableView *q;
  QStyleOptionViewItem opt;
  QStyleOptionViewItem *in_stack_fffffffffffffe98;
  undefined1 *puVar10;
  undefined7 in_stack_fffffffffffffea0;
  undefined1 in_stack_fffffffffffffea7;
  undefined4 in_stack_fffffffffffffeb8;
  ColorGroup in_stack_fffffffffffffebc;
  QFlagsStorageHelper<Qt::ItemFlag,_4> local_e0;
  QFlagsStorageHelper<QStyle::StateFlag,_4> local_dc;
  undefined1 local_d8 [8];
  QFlags<QStyle::StateFlag> aQStack_d0 [8];
  QPalette aQStack_b0 [10];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar5 = q_func(in_RDI);
  memset(local_d8,0xaa,0xd0);
  QStyleOptionViewItem::QStyleOptionViewItem
            ((QStyleOptionViewItem *)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),
             in_stack_fffffffffffffe98);
  bVar2 = ::QPointer::operator_cast_to_bool((QPointer<QItemSelectionModel> *)0x8b4ade);
  if (bVar2) {
    pQVar6 = QPointer<QItemSelectionModel>::operator->((QPointer<QItemSelectionModel> *)0x8b4af5);
    uVar7 = QItemSelectionModel::isSelected((QModelIndex *)pQVar6);
    if ((uVar7 & 1) != 0) {
      QFlags<QStyle::StateFlag>::operator|=(aQStack_d0,State_Selected);
    }
  }
  bVar2 = ::operator==((QModelIndex *)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),
                       (QPersistentModelIndex *)in_stack_fffffffffffffe98);
  if (bVar2) {
    QFlags<QStyle::StateFlag>::operator|=(aQStack_d0,State_MouseOver);
  }
  local_dc.super_QFlagsStorage<QStyle::StateFlag>.i =
       (QFlagsStorage<QStyle::StateFlag>)
       QFlags<QStyle::StateFlag>::operator&
                 ((QFlags<QStyle::StateFlag> *)
                  CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),
                  (StateFlag)((ulong)in_stack_fffffffffffffe98 >> 0x20));
  IVar3 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_dc);
  if (IVar3 != 0) {
    pQVar1 = (in_RDI->super_QAbstractItemViewPrivate).model;
    (**(code **)(*(long *)pQVar1 + 0x138))(pQVar1,in_RCX);
    local_e0.super_QFlagsStorage<Qt::ItemFlag>.i =
         (QFlagsStorage<Qt::ItemFlag>)
         QFlags<Qt::ItemFlag>::operator&
                   ((QFlags<Qt::ItemFlag> *)
                    CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),
                    (ItemFlag)((ulong)in_stack_fffffffffffffe98 >> 0x20));
    IVar4 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_e0);
    if (IVar4 == 0) {
      QFlags<QStyle::StateFlag>::operator&=(aQStack_d0,-2);
    }
    in_stack_fffffffffffffebc = (ColorGroup)(IVar4 == 0);
    QPalette::setCurrentColorGroup(aQStack_b0,in_stack_fffffffffffffebc);
  }
  QAbstractItemView::currentIndex((QAbstractItemView *)in_RDI);
  bVar2 = ::operator==((QModelIndex *)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),
                       (QModelIndex *)in_stack_fffffffffffffe98);
  if (!bVar2) goto LAB_008b4cb3;
  bVar2 = QWidget::hasFocus((QWidget *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8)
                           );
  if (bVar2) {
LAB_008b4c6d:
    QAbstractItemView::currentIndex((QAbstractItemView *)in_RDI);
    in_stack_fffffffffffffea7 =
         QModelIndex::isValid
                   ((QModelIndex *)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0));
  }
  else {
    bVar2 = QWidget::hasFocus((QWidget *)
                              CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    in_stack_fffffffffffffea7 = false;
    if (bVar2) goto LAB_008b4c6d;
  }
  if ((bool)in_stack_fffffffffffffea7 != false) {
    QFlags<QStyle::StateFlag>::operator|=(aQStack_d0,State_HasFocus);
  }
LAB_008b4cb3:
  pQVar8 = QWidget::style((QWidget *)in_stack_fffffffffffffe98);
  puVar10 = local_d8;
  (**(code **)(*(long *)pQVar8 + 0xb0))(pQVar8,0x2d,puVar10,in_RSI,pQVar5);
  plVar9 = (long *)(**(code **)(*(long *)&(pQVar5->super_QAbstractItemView).
                                          super_QAbstractScrollArea.super_QFrame.super_QWidget +
                               0x208))(pQVar5,in_RCX);
  (**(code **)(*plVar9 + 0x60))(plVar9,in_RSI,puVar10,in_RCX);
  QStyleOptionViewItem::~QStyleOptionViewItem
            ((QStyleOptionViewItem *)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0));
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTableViewPrivate::drawCell(QPainter *painter, const QStyleOptionViewItem &option, const QModelIndex &index)
{
    Q_Q(QTableView);
    QStyleOptionViewItem opt = option;

    if (selectionModel && selectionModel->isSelected(index))
        opt.state |= QStyle::State_Selected;
    if (index == hover)
        opt.state |= QStyle::State_MouseOver;
    if (option.state & QStyle::State_Enabled) {
        QPalette::ColorGroup cg;
        if ((model->flags(index) & Qt::ItemIsEnabled) == 0) {
            opt.state &= ~QStyle::State_Enabled;
            cg = QPalette::Disabled;
        } else {
            cg = QPalette::Normal;
        }
        opt.palette.setCurrentColorGroup(cg);
    }

    if (index == q->currentIndex()) {
        const bool focus = (q->hasFocus() || viewport->hasFocus()) && q->currentIndex().isValid();
        if (focus)
            opt.state |= QStyle::State_HasFocus;
    }

    q->style()->drawPrimitive(QStyle::PE_PanelItemViewRow, &opt, painter, q);

    q->itemDelegateForIndex(index)->paint(painter, opt, index);
}